

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O2

FT_ULong FT_Stream_GetULong(FT_Stream stream)

{
  uint uVar1;
  FT_ULong FVar2;
  uint *puVar3;
  
  puVar3 = (uint *)stream->cursor;
  if ((uchar *)((long)puVar3 + 3U) < stream->limit) {
    uVar1 = *puVar3;
    puVar3 = puVar3 + 1;
    FVar2 = (FT_ULong)
            (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  }
  else {
    FVar2 = 0;
  }
  stream->cursor = (uchar *)puVar3;
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_GetULong( FT_Stream  stream )
  {
    FT_Byte*  p;
    FT_ULong  result;


    FT_ASSERT( stream && stream->cursor );

    result         = 0;
    p              = stream->cursor;
    if ( p + 3 < stream->limit )
      result       = FT_NEXT_ULONG( p );
    stream->cursor = p;
    return result;
  }